

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_number.cpp
# Opt level: O2

void __thiscall JsonNumber_OneExpMinusZero2_Test::TestBody(JsonNumber_OneExpMinusZero2_Test *this)

{
  TypedExpectation<std::error_code_(double)> *this_00;
  parser<callbacks_proxy<mock_json_callbacks>_> *this_01;
  char *in_R9;
  AssertHelper local_100;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  AssertionResult gtest_ar_;
  parser<callbacks_proxy<mock_json_callbacks>_> p;
  
  gtest_ar_.success_ = true;
  gtest_ar_._1_7_ = 0x3f847ae147ae14;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )((ulong)gtest_ar_.message_._M_t.
                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl & 0xffffffffffffff00);
  testing::internal::FloatingEqMatcher::operator_cast_to_Matcher
            ((Matcher<double> *)&local_f0,(FloatingEqMatcher *)&gtest_ar_);
  mock_json_callbacks::gmock_double_value
            ((MockSpec<std::error_code_(double)> *)&p,
             &(this->super_JsonNumber).callbacks_.super_mock_json_callbacks,
             (Matcher<double> *)&local_f0);
  testing::internal::GetWithoutMatchers();
  this_00 = testing::internal::MockSpec<std::error_code_(double)>::InternalExpectedAt
                      ((MockSpec<std::error_code_(double)> *)&p,
                       "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_number.cpp"
                       ,0xab,"callbacks_","double_value (DoubleEq (0.01))");
  testing::internal::TypedExpectation<std::error_code_(double)>::Times(this_00,1);
  testing::internal::MatcherBase<double>::~MatcherBase((MatcherBase<double> *)&p.stack_);
  testing::internal::MatcherBase<double>::~MatcherBase((MatcherBase<double> *)&local_f0);
  pstore::json::parser<callbacks_proxy<mock_json_callbacks>_>::parser
            (&p,(this->super_JsonNumber).proxy_.original_,none);
  s_abi_cxx11_(&local_f0,"1E-02",5);
  this_01 = pstore::json::parser<callbacks_proxy<mock_json_callbacks>_>::input(&p,&local_f0);
  pstore::json::parser<callbacks_proxy<mock_json_callbacks>_>::eof(this_01);
  std::__cxx11::string::~string((string *)&local_f0);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ = p.error_._M_value == 0;
  if (p.error_._M_value != 0) {
    testing::Message::Message((Message *)&local_f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_f0,(internal *)&gtest_ar_,(AssertionResult *)"p.has_error ()","true","false",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_number.cpp"
               ,0xae,local_f0._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_100,(Message *)&local_f8);
    testing::internal::AssertHelper::~AssertHelper(&local_100);
    std::__cxx11::string::~string((string *)&local_f0);
    if (local_f8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_f8._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  pstore::json::parser<callbacks_proxy<mock_json_callbacks>_>::~parser(&p);
  return;
}

Assistant:

TEST_F (JsonNumber, OneExpMinusZero2) {
    EXPECT_CALL (callbacks_, double_value (DoubleEq (0.01))).Times (1);
    json::parser<decltype (proxy_)> p (proxy_);
    p.input ("1E-02"s).eof ();
    EXPECT_FALSE (p.has_error ());
}